

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.h
# Opt level: O0

void __thiscall cmGraphVizWriter::Connection::~Connection(Connection *this)

{
  Connection *this_local;
  
  std::__cxx11::string::~string((string *)&this->scopeType);
  cmLinkItem::~cmLinkItem(&this->dst);
  cmLinkItem::~cmLinkItem(&this->src);
  return;
}

Assistant:

Connection(cmLinkItem s, cmLinkItem d, std::string scope)
      : src(std::move(s))
      , dst(std::move(d))
      , scopeType(std::move(scope))
    {
    }